

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Sweep.c
# Opt level: O0

void Llb_Nonlin4SweepPrint(Vec_Ptr_t *vFuncs)

{
  uint uVar1;
  int iVar2;
  DdNode *node;
  int local_1c;
  int i;
  DdNode *bFunc;
  Vec_Ptr_t *vFuncs_local;
  
  uVar1 = Vec_PtrSize(vFuncs);
  printf("(%d) ",(ulong)uVar1);
  for (local_1c = 0; iVar2 = Vec_PtrSize(vFuncs), local_1c < iVar2; local_1c = local_1c + 1) {
    node = (DdNode *)Vec_PtrEntry(vFuncs,local_1c);
    uVar1 = Cudd_DagSize(node);
    printf("%d ",(ulong)uVar1);
  }
  printf("\n");
  return;
}

Assistant:

void Llb_Nonlin4SweepPrint( Vec_Ptr_t * vFuncs )
{
    DdNode * bFunc;
    int i;
    printf( "(%d) ", Vec_PtrSize(vFuncs) );
    Vec_PtrForEachEntry( DdNode *, vFuncs, bFunc, i )
        printf( "%d ", Cudd_DagSize(bFunc) );
    printf( "\n" );
}